

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O1

Clause * __thiscall value_precede::ex_s(value_precede *this,int si,int ti)

{
  IntVar *pIVar1;
  Clause *pCVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  Clause *c;
  Clause *local_38;
  
  local_38 = (Clause *)malloc((long)ti * 4 + 0xc);
  *(uint *)local_38 = (*(uint *)local_38 & 0xfc) + ti * 0x100 + 0x102;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
  pCVar2 = local_38;
  if (si < 1) {
    uVar5 = 1;
  }
  else {
    uVar4 = 1;
    do {
      pIVar1 = (this->xs).data[uVar4 - 1];
      iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                        (pIVar1,(long)*(int *)&(this->super_Propagator).field_0x14,1);
      if (*(uint *)pCVar2 >> 8 <= uVar4) goto LAB_00171feb;
      pCVar2->data[uVar4].x = iVar3;
      uVar5 = uVar4 + 1;
      bVar7 = uVar4 != (uint)si;
      uVar4 = uVar5;
    } while (bVar7);
  }
  uVar6 = si + 1;
  if ((int)uVar6 < ti) {
    uVar5 = uVar5 & 0xffffffff;
    do {
      pIVar1 = (this->xs).data[uVar6];
      iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                        (pIVar1,(long)*(int *)&(this->super_Propagator).field_0x14,1);
      if (*(uint *)pCVar2 >> 8 <= uVar5) goto LAB_00171feb;
      pCVar2->data[uVar5].x = iVar3;
      uVar5 = uVar5 + 1;
      uVar6 = uVar6 + 1;
    } while (ti != uVar6);
  }
  pIVar1 = (this->xs).data[(uint)ti];
  iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])(pIVar1,(long)this->t,0);
  if ((uint)uVar5 < *(uint *)pCVar2 >> 8) {
    pCVar2->data[uVar5 & 0xffffffff].x = iVar3;
    return pCVar2;
  }
LAB_00171feb:
  abort();
}

Assistant:

Clause* ex_s(int si, int ti) {
		Clause* r(Reason_new(ti + 1));
		int jj = 1;
		for (int ii = 0; ii < si; ++ii, ++jj) {
			(*r)[jj] = xs[ii]->getLit(s, LR_EQ);
		}
		for (int ii = si + 1; ii < ti; ++ii, ++jj) {
			(*r)[jj] = xs[ii]->getLit(s, LR_EQ);
		}
		(*r)[jj++] = xs[ti]->getLit(t, LR_NE);
		assert(jj == ti + 1);
		return r;
	}